

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

RPCHelpMan * wallet::upgradewallet(void)

{
  string name;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  Fallback fallback;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  string description_06;
  RPCMethodImpl fun;
  RPCArgOptions opts;
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  long lVar3;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  undefined4 in_stack_fffffffffffff648;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffff64c;
  undefined8 in_stack_fffffffffffff650;
  undefined8 in_stack_fffffffffffff658;
  undefined8 in_stack_fffffffffffff660;
  _Manager_type in_stack_fffffffffffff668;
  undefined8 in_stack_fffffffffffff670;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff678;
  pointer in_stack_fffffffffffff688;
  pointer pRVar5;
  pointer in_stack_fffffffffffff690;
  pointer pRVar6;
  pointer in_stack_fffffffffffff698;
  pointer pRVar7;
  undefined8 in_stack_fffffffffffff6a0;
  pointer in_stack_fffffffffffff6a8;
  pointer pRVar8;
  pointer in_stack_fffffffffffff6b0;
  pointer pRVar9;
  pointer in_stack_fffffffffffff6b8;
  pointer pRVar10;
  undefined8 in_stack_fffffffffffff6c0;
  pointer in_stack_fffffffffffff6c8;
  pointer pRVar11;
  pointer in_stack_fffffffffffff6d0;
  pointer pRVar12;
  pointer in_stack_fffffffffffff6d8;
  pointer pRVar13;
  undefined8 in_stack_fffffffffffff6e0;
  pointer in_stack_fffffffffffff6e8;
  pointer pRVar14;
  pointer in_stack_fffffffffffff6f0;
  pointer pRVar15;
  pointer in_stack_fffffffffffff6f8;
  undefined8 in_stack_fffffffffffff700;
  pointer in_stack_fffffffffffff708;
  pointer in_stack_fffffffffffff710;
  pointer in_stack_fffffffffffff718;
  undefined1 in_stack_fffffffffffff720 [16];
  vector<RPCResult,_std::allocator<RPCResult>_> local_8d0;
  allocator<char> local_8b2;
  allocator<char> local_8b1;
  RPCResults local_8b0;
  allocator_type local_892;
  allocator<char> local_891;
  int local_890;
  allocator<char> local_889;
  vector<RPCArg,_std::allocator<RPCArg>_> local_888;
  allocator<char> local_86a;
  allocator<char> local_869;
  string local_868;
  string local_848;
  string local_828;
  string local_808;
  string local_7e8;
  string local_7c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a8;
  char *local_788;
  size_type local_780;
  char local_778 [8];
  undefined8 uStack_770;
  string local_768 [32];
  string local_748 [32];
  string local_728 [32];
  string local_708 [32];
  string local_6e8 [32];
  string local_6c8 [32];
  string local_6a8 [32];
  string local_688 [32];
  string local_668 [32];
  string local_648 [32];
  RPCResult local_628 [4];
  RPCResult local_408;
  string local_380 [32];
  string local_360 [32];
  RPCResult local_340;
  RPCArgOptions local_2b8;
  string local_270 [32];
  UniValue local_250;
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_1f8;
  string local_198 [32];
  RPCArg local_178;
  string local_70 [32];
  string local_50 [32];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"upgradewallet",&local_869);
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,
             "\nUpgrade the wallet. Upgrades to the latest version if no version number is specified.\nNew keys may be generated and a new wallet backup will need to be made."
             ,&local_86a);
  std::__cxx11::string::string<std::allocator<char>>(local_198,"version",&local_889);
  local_890 = 0x297ac;
  UniValue::UniValue<int,_int,_true>(&local_250,&local_890);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_1f8,&local_250);
  std::__cxx11::string::string<std::allocator<char>>
            (local_270,"The version number to upgrade to. Default is the latest wallet version.",
             &local_891);
  local_2b8.oneline_description._M_dataplus._M_p = (pointer)&local_2b8.oneline_description.field_2;
  local_2b8.skip_type_check = false;
  local_2b8.oneline_description._M_string_length = 0;
  local_2b8.oneline_description.field_2._M_local_buf[0] = '\0';
  local_2b8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_2b8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_2b8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_2b8._58_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff64c;
  name._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff648;
  name._M_string_length = in_stack_fffffffffffff650;
  name.field_2._M_allocated_capacity = in_stack_fffffffffffff658;
  name.field_2._8_8_ = in_stack_fffffffffffff660;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff670;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff668;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff678;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff688;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff690;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff698;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff6a0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff6a8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff6b0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_fffffffffffff6b8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_fffffffffffff6c0;
  description_06._M_string_length = (size_type)in_stack_fffffffffffff6d0;
  description_06._M_dataplus._M_p = (pointer)in_stack_fffffffffffff6c8;
  description_06.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff6d8;
  description_06.field_2._8_8_ = in_stack_fffffffffffff6e0;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff6f0;
  opts._0_8_ = in_stack_fffffffffffff6e8;
  opts.oneline_description._M_string_length = (size_type)in_stack_fffffffffffff6f8;
  opts.oneline_description.field_2._M_allocated_capacity = in_stack_fffffffffffff700;
  opts.oneline_description.field_2._8_8_ = in_stack_fffffffffffff708;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff710;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff718;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff720._0_8_;
  opts.hidden = (bool)in_stack_fffffffffffff720[8];
  opts.also_positional = (bool)in_stack_fffffffffffff720[9];
  opts._66_6_ = in_stack_fffffffffffff720._10_6_;
  RPCArg::RPCArg(&local_178,name,(Type)local_198,fallback,description_06,opts);
  __l._M_len = 1;
  __l._M_array = &local_178;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_888,__l,&local_892);
  std::__cxx11::string::string<std::allocator<char>>(local_360,"",&local_8b1);
  std::__cxx11::string::string<std::allocator<char>>(local_380,"",&local_8b2);
  std::__cxx11::string::string<std::allocator<char>>
            (local_648,"wallet_name",(allocator<char> *)&stack0xfffffffffffff72f);
  std::__cxx11::string::string<std::allocator<char>>
            (local_668,"Name of wallet this operation was performed on",
             (allocator<char> *)&stack0xfffffffffffff72e);
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff64c;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff648;
  m_key_name._M_string_length = in_stack_fffffffffffff650;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff658;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff660;
  description._M_string_length = in_stack_fffffffffffff670;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff668;
  description.field_2 = in_stack_fffffffffffff678;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_fffffffffffff690;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_fffffffffffff688;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffff698;
  RPCResult::RPCResult(local_628,STR,m_key_name,description,inner,SUB81(local_648,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_688,"previous_version",(allocator<char> *)&stack0xfffffffffffff707);
  std::__cxx11::string::string<std::allocator<char>>
            (local_6a8,"Version of wallet before this operation",
             (allocator<char> *)&stack0xfffffffffffff706);
  pRVar14 = (pointer)0x0;
  pRVar15 = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff64c;
  m_key_name_00._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff648;
  m_key_name_00._M_string_length = in_stack_fffffffffffff650;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff658;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffff660;
  description_00._M_string_length = in_stack_fffffffffffff670;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff668;
  description_00.field_2 = in_stack_fffffffffffff678;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff690;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff688;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff698;
  RPCResult::RPCResult(local_628 + 1,NUM,m_key_name_00,description_00,inner_00,SUB81(local_688,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_6c8,"current_version",(allocator<char> *)&stack0xfffffffffffff6e7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_6e8,"Version of wallet after this operation",
             (allocator<char> *)&stack0xfffffffffffff6e6);
  pRVar11 = (pointer)0x0;
  pRVar12 = (pointer)0x0;
  pRVar13 = (pointer)0x0;
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff64c;
  m_key_name_01._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff648;
  m_key_name_01._M_string_length = in_stack_fffffffffffff650;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_fffffffffffff658;
  m_key_name_01.field_2._8_8_ = in_stack_fffffffffffff660;
  description_01._M_string_length = in_stack_fffffffffffff670;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff668;
  description_01.field_2 = in_stack_fffffffffffff678;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff690;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff688;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff698;
  RPCResult::RPCResult(local_628 + 2,NUM,m_key_name_01,description_01,inner_01,SUB81(local_6c8,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_708,"result",(allocator<char> *)&stack0xfffffffffffff6c7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_728,"Description of result, if no error",
             (allocator<char> *)&stack0xfffffffffffff6c6);
  pRVar8 = (pointer)0x0;
  pRVar9 = (pointer)0x0;
  pRVar10 = (pointer)0x0;
  auVar1._4_8_ = in_stack_fffffffffffff650;
  auVar1._0_4_ = in_stack_fffffffffffff64c;
  auVar1._12_8_ = in_stack_fffffffffffff658;
  auVar1._20_8_ = in_stack_fffffffffffff660;
  auVar1._28_4_ = 0;
  description_02._M_string_length = in_stack_fffffffffffff670;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff668;
  description_02.field_2 = in_stack_fffffffffffff678;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff690;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff688;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff698;
  RPCResult::RPCResult
            (local_628 + 3,STR,(string)(auVar1 << 0x20),SUB81(local_708,0),description_02,inner_02,
             true);
  std::__cxx11::string::string<std::allocator<char>>
            (local_748,"error",(allocator<char> *)&stack0xfffffffffffff6a7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_768,"Error message (if there is one)",(allocator<char> *)&stack0xfffffffffffff6a6
            );
  pRVar5 = (pointer)0x0;
  pRVar6 = (pointer)0x0;
  pRVar7 = (pointer)0x0;
  uVar4 = 0;
  auVar2._4_8_ = in_stack_fffffffffffff650;
  auVar2._0_4_ = in_stack_fffffffffffff64c;
  auVar2._12_8_ = in_stack_fffffffffffff658;
  auVar2._20_8_ = in_stack_fffffffffffff660;
  auVar2._28_4_ = 0;
  description_03._M_string_length = in_stack_fffffffffffff670;
  description_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff668;
  description_03.field_2._M_local_buf = in_stack_fffffffffffff678._M_local_buf;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult
            (&local_408,STR,(string)(auVar2 << 0x20),SUB81(local_748,0),description_03,inner_03,true
            );
  __l_00._M_len = 5;
  __l_00._M_array = local_628;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_8d0,__l_00,(allocator_type *)&stack0xfffffffffffff687);
  m_key_name_02._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff64c;
  m_key_name_02._M_dataplus._M_p._0_4_ = uVar4;
  m_key_name_02._M_string_length = in_stack_fffffffffffff650;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_fffffffffffff658;
  m_key_name_02.field_2._8_8_ = in_stack_fffffffffffff660;
  description_04._M_string_length = in_stack_fffffffffffff670;
  description_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff668;
  description_04.field_2 = in_stack_fffffffffffff678;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar6;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar5;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar7;
  RPCResult::RPCResult(&local_340,OBJ,m_key_name_02,description_04,inner_04,SUB81(local_360,0));
  result._4_4_ = in_stack_fffffffffffff64c;
  result.m_type = uVar4;
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff650;
  result.m_key_name._M_string_length = in_stack_fffffffffffff658;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff660;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff668;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff670;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffff678;
  result._64_8_ = pRVar5;
  result.m_description._M_dataplus._M_p = (pointer)pRVar6;
  result.m_description._M_string_length = (size_type)pRVar7;
  result.m_description.field_2._M_allocated_capacity = in_stack_fffffffffffff6a0;
  result.m_description.field_2._8_8_ = pRVar8;
  result.m_cond._M_dataplus._M_p = (pointer)pRVar9;
  result.m_cond._M_string_length = (size_type)pRVar10;
  result.m_cond.field_2._M_allocated_capacity = in_stack_fffffffffffff6c0;
  result.m_cond.field_2._8_8_ = pRVar11;
  RPCResults::RPCResults(&local_8b0,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"upgradewallet",(allocator<char> *)&stack0xfffffffffffff686);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_808,"169900",(allocator<char> *)&stack0xfffffffffffff685);
  HelpExampleCli(&local_7c8,&local_7e8,&local_808);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_848,"upgradewallet",(allocator<char> *)&stack0xfffffffffffff684);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_868,"169900",(allocator<char> *)&stack0xfffffffffffff683);
  HelpExampleRpc(&local_828,&local_848,&local_868);
  std::operator+(&local_7a8,&local_7c8,&local_828);
  local_788 = local_778;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7a8._M_dataplus._M_p == &local_7a8.field_2) {
    uStack_770 = local_7a8.field_2._8_8_;
  }
  else {
    local_788 = local_7a8._M_dataplus._M_p;
  }
  local_780 = local_7a8._M_string_length;
  local_7a8._M_string_length = 0;
  local_7a8.field_2._M_local_buf[0] = '\0';
  description_05._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/wallet.cpp:601:9)>
       ::_M_invoke;
  description_05._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/wallet.cpp:601:9)>
                ::_M_manager;
  description_05.field_2 = in_stack_fffffffffffff678;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar6;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar5;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar7;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar8;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff6a0;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar9;
  examples.m_examples._M_string_length = in_stack_fffffffffffff6c0;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar10;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar11;
  examples.m_examples.field_2._8_8_ = pRVar12;
  fun.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffff6e0;
  fun.super__Function_base._M_functor._M_unused._M_object = pRVar13;
  fun.super__Function_base._M_manager = (_Manager_type)pRVar14;
  fun._M_invoker = (_Invoker_type)pRVar15;
  local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_fffffffffffff650,&stack0xfffffffffffff658)),
             description_05,args,results,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffff658);
  std::__cxx11::string::~string((string *)&local_788);
  std::__cxx11::string::~string((string *)&local_7a8);
  std::__cxx11::string::~string((string *)&local_828);
  std::__cxx11::string::~string((string *)&local_868);
  std::__cxx11::string::~string((string *)&local_848);
  std::__cxx11::string::~string((string *)&local_7c8);
  std::__cxx11::string::~string((string *)&local_808);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_8b0.m_results);
  RPCResult::~RPCResult(&local_340);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_8d0);
  lVar3 = 0x220;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_628[0].m_type + lVar3));
    lVar3 = lVar3 + -0x88;
  } while (lVar3 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff688);
  std::__cxx11::string::~string(local_768);
  std::__cxx11::string::~string(local_748);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff6a8);
  std::__cxx11::string::~string(local_728);
  std::__cxx11::string::~string(local_708);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff6c8);
  std::__cxx11::string::~string(local_6e8);
  std::__cxx11::string::~string(local_6c8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff6e8);
  std::__cxx11::string::~string(local_6a8);
  std::__cxx11::string::~string(local_688);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff708);
  std::__cxx11::string::~string(local_668);
  std::__cxx11::string::~string(local_648);
  std::__cxx11::string::~string(local_380);
  std::__cxx11::string::~string(local_360);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_888);
  RPCArg::~RPCArg(&local_178);
  RPCArgOptions::~RPCArgOptions(&local_2b8);
  std::__cxx11::string::~string(local_270);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_1f8);
  UniValue::~UniValue(&local_250);
  std::__cxx11::string::~string(local_198);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan upgradewallet()
{
    return RPCHelpMan{"upgradewallet",
        "\nUpgrade the wallet. Upgrades to the latest version if no version number is specified.\n"
        "New keys may be generated and a new wallet backup will need to be made.",
        {
            {"version", RPCArg::Type::NUM, RPCArg::Default{int{FEATURE_LATEST}}, "The version number to upgrade to. Default is the latest wallet version."}
        },
        RPCResult{
            RPCResult::Type::OBJ, "", "",
            {
                {RPCResult::Type::STR, "wallet_name", "Name of wallet this operation was performed on"},
                {RPCResult::Type::NUM, "previous_version", "Version of wallet before this operation"},
                {RPCResult::Type::NUM, "current_version", "Version of wallet after this operation"},
                {RPCResult::Type::STR, "result", /*optional=*/true, "Description of result, if no error"},
                {RPCResult::Type::STR, "error", /*optional=*/true, "Error message (if there is one)"}
            },
        },
        RPCExamples{
            HelpExampleCli("upgradewallet", "169900")
            + HelpExampleRpc("upgradewallet", "169900")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    std::shared_ptr<CWallet> const pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    EnsureWalletIsUnlocked(*pwallet);

    int version = 0;
    if (!request.params[0].isNull()) {
        version = request.params[0].getInt<int>();
    }
    bilingual_str error;
    const int previous_version{pwallet->GetVersion()};
    const bool wallet_upgraded{pwallet->UpgradeWallet(version, error)};
    const int current_version{pwallet->GetVersion()};
    std::string result;

    if (wallet_upgraded) {
        if (previous_version == current_version) {
            result = "Already at latest version. Wallet version unchanged.";
        } else {
            result = strprintf("Wallet upgraded successfully from version %i to version %i.", previous_version, current_version);
        }
    }

    UniValue obj(UniValue::VOBJ);
    obj.pushKV("wallet_name", pwallet->GetName());
    obj.pushKV("previous_version", previous_version);
    obj.pushKV("current_version", current_version);
    if (!result.empty()) {
        obj.pushKV("result", result);
    } else {
        CHECK_NONFATAL(!error.empty());
        obj.pushKV("error", error.original);
    }
    return obj;
},
    };
}